

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ReduceMinLayerParams::InternalSwap
          (ReduceMinLayerParams *this,ReduceMinLayerParams *other)

{
  intptr_t iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::RepeatedField<long>::InternalSwap(&this->axes_,&other->axes_);
  bVar3 = this->keepdims_;
  bVar4 = this->reduceall_;
  bVar2 = other->reduceall_;
  this->keepdims_ = other->keepdims_;
  this->reduceall_ = bVar2;
  other->keepdims_ = bVar3;
  other->reduceall_ = bVar4;
  return;
}

Assistant:

void ReduceMinLayerParams::InternalSwap(ReduceMinLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  axes_.InternalSwap(&other->axes_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ReduceMinLayerParams, reduceall_)
      + sizeof(ReduceMinLayerParams::reduceall_)
      - PROTOBUF_FIELD_OFFSET(ReduceMinLayerParams, keepdims_)>(
          reinterpret_cast<char*>(&keepdims_),
          reinterpret_cast<char*>(&other->keepdims_));
}